

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

Block * __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
::
requisition_block<(duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
          (ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
           *this)

{
  ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
  *in_stack_00000008;
  Block *block;
  Block *local_8;
  
  local_8 = ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
            ::try_get_block_from_initial_pool(in_stack_00000008);
  if ((local_8 == (Block *)0x0) &&
     (local_8 = ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                ::try_get_block_from_free_list
                          ((ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                            *)0x9ca3ab), local_8 == (Block *)0x0)) {
    local_8 = create<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
                        ();
  }
  return local_8;
}

Assistant:

Block* requisition_block()
	{
		auto block = try_get_block_from_initial_pool();
		if (block != nullptr) {
			return block;
		}
		
		block = try_get_block_from_free_list();
		if (block != nullptr) {
			return block;
		}
		
		MOODYCAMEL_CONSTEXPR_IF (canAlloc == CanAlloc) {
			return create<Block>();
		}
		else {
			return nullptr;
		}
	}